

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Matchers::Floating::WithinAbsMatcher::WithinAbsMatcher
          (WithinAbsMatcher *this,double target,double margin)

{
  ReusableStringStream *pRVar1;
  char local_65 [13];
  ReusableStringStream local_58;
  string local_40;
  double local_20;
  double margin_local;
  double target_local;
  WithinAbsMatcher *this_local;
  
  local_20 = margin;
  margin_local = target;
  target_local = (double)this;
  Impl::MatcherBase<double>::MatcherBase(&this->super_MatcherBase<double>);
  (this->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__WithinAbsMatcher_0025bd88;
  (this->super_MatcherBase<double>).super_MatcherMethod<double>._vptr_MatcherMethod =
       (_func_int **)&DAT_0025bdb8;
  this->m_target = margin_local;
  this->m_margin = local_20;
  if (local_20 < 0.0) {
    ReusableStringStream::ReusableStringStream(&local_58);
    pRVar1 = ReusableStringStream::operator<<(&local_58,(char (*) [17])"Invalid margin: ");
    pRVar1 = ReusableStringStream::operator<<(pRVar1,&local_20);
    local_65[0] = '.';
    pRVar1 = ReusableStringStream::operator<<(pRVar1,local_65);
    pRVar1 = ReusableStringStream::operator<<
                       (pRVar1,(char (*) [32])" Margin has to be non-negative.");
    ReusableStringStream::str_abi_cxx11_(&local_40,pRVar1);
    throw_domain_error(&local_40);
  }
  return;
}

Assistant:

WithinAbsMatcher::WithinAbsMatcher(double target, double margin)
        :m_target{ target }, m_margin{ margin } {
        CATCH_ENFORCE(margin >= 0, "Invalid margin: " << margin << '.'
            << " Margin has to be non-negative.");
    }